

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

IndirOpnd * __thiscall
Lowerer::GenerateFastElemICommon
          (Lowerer *this,Instr *elemInstr,bool isStore,IndirOpnd *indirOpnd,LabelInstr *labelHelper,
          LabelInstr *labelCantUseArray,LabelInstr *labelFallthrough,bool *pIsTypedArrayElement,
          bool *pIsStringIndex,bool *emitBailoutRef,Opnd **maskOpnd,
          LabelInstr **pLabelSegmentLengthIncreased,bool checkArrayLengthOverflow,
          bool forceGenerateFastPath,bool returnLength,LabelInstr *bailOutLabelInstr,
          bool *indirOpndOverflowed,FldInfoFlags flags)

{
  RegOpnd *this_00;
  RegOpnd *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IndirOpnd *pIVar5;
  undefined7 in_register_00000011;
  bool bVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_54;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  LabelInstr *local_50;
  Instr *local_48;
  Lowerer *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,isStore);
  *pIsTypedArrayElement = false;
  *pIsStringIndex = false;
  if (pLabelSegmentLengthIncreased != (LabelInstr **)0x0) {
    *pLabelSegmentLengthIncreased = (LabelInstr *)0x0;
  }
  if (maskOpnd != (Opnd **)0x0) {
    *maskOpnd = (Opnd *)0x0;
  }
  if (indirOpndOverflowed != (bool *)0x0) {
    *indirOpndOverflowed = false;
  }
  if (emitBailoutRef != (bool *)0x0) {
    *emitBailoutRef = false;
  }
  this_00 = indirOpnd->m_baseOpnd;
  local_50 = labelHelper;
  local_48 = elemInstr;
  local_40 = this;
  if (this_00 == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3ff7,"(baseOpnd)","This shouldn\'t be NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = IR::Opnd::IsTaggedInt(&this_00->super_Opnd);
  if (bVar3) {
LAB_005de88f:
    pIVar5 = (IndirOpnd *)0x0;
  }
  else {
    pRVar1 = indirOpnd->m_indexOpnd;
    if (pRVar1 != (RegOpnd *)0x0) {
      local_54 = (this_00->super_Opnd).m_valueType.field_0;
      bVar3 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_54.field_0);
      if ((flags & (FldInfo_FromLocalWithoutProperty|FldInfo_FromProto|FldInfo_FromLocal)) ==
          FldInfo_NoInfo || bVar3) {
        local_36 = (pRVar1->super_Opnd).m_valueType.field_0;
        bVar3 = ValueType::IsLikelyString((ValueType *)&local_36.field_0);
        bVar6 = false;
        if (bVar3) {
          return (IndirOpnd *)0x0;
        }
      }
      else {
        bVar6 = (flags & (FldInfo_FromAuxSlots|FldInfo_FromInlineSlots)) != FldInfo_NoInfo;
        local_36 = (pRVar1->super_Opnd).m_valueType.field_0;
        bVar3 = ValueType::IsLikelyString((ValueType *)&local_36.field_0);
        if (bVar3) {
          if ((flags & (FldInfo_FromAuxSlots|FldInfo_FromInlineSlots)) != FldInfo_NoInfo) {
            *pIsTypedArrayElement = false;
            *pIsStringIndex = true;
            pIVar5 = GenerateFastElemIStringIndexCommon
                               (local_40,local_48,local_34._0_1_,indirOpnd,local_50,flags);
            return pIVar5;
          }
          goto LAB_005de88f;
        }
      }
      local_52 = (pRVar1->super_Opnd).m_valueType.field_0;
      bVar3 = ValueType::IsLikelySymbol((ValueType *)&local_52.field_0);
      if ((bVar6 & bVar3) == 1) {
        pIVar5 = GenerateFastElemISymbolIndexCommon
                           (local_40,local_48,local_34._0_1_,indirOpnd,local_50,flags);
        return pIVar5;
      }
      if (bVar3) goto LAB_005de88f;
    }
    pIVar5 = GenerateFastElemIIntIndexCommon
                       (local_40,local_48,local_34._0_1_,indirOpnd,local_50,labelCantUseArray,
                        labelFallthrough,pIsTypedArrayElement,emitBailoutRef,
                        pLabelSegmentLengthIncreased,checkArrayLengthOverflow,maskOpnd,false,
                        returnLength,bailOutLabelInstr,indirOpndOverflowed);
  }
  return pIVar5;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemICommon(
    _In_ IR::Instr* elemInstr,
    _In_ bool isStore,
    _In_ IR::IndirOpnd* indirOpnd,
    _In_ IR::LabelInstr* labelHelper,
    _In_ IR::LabelInstr* labelCantUseArray,
    _In_opt_ IR::LabelInstr* labelFallthrough,
    _Out_ bool* pIsTypedArrayElement,
    _Out_ bool* pIsStringIndex,
    _Out_opt_ bool* emitBailoutRef,
    _Outptr_opt_result_maybenull_ IR::Opnd** maskOpnd,
    _Outptr_opt_result_maybenull_ IR::LabelInstr** pLabelSegmentLengthIncreased, // = nullptr
    _In_ bool checkArrayLengthOverflow, //  = true
    _In_ bool forceGenerateFastPath, // = false
    _In_ bool returnLength, // = false
    _In_opt_ IR::LabelInstr* bailOutLabelInstr, // = nullptr
    _Out_opt_ bool* indirOpndOverflowed, // = nullptr
    _In_ Js::FldInfoFlags flags) // = Js::FldInfo_NoInfo
{
    *pIsTypedArrayElement = false;
    *pIsStringIndex = false;
    if(pLabelSegmentLengthIncreased)
    {
        *pLabelSegmentLengthIncreased = nullptr;
    }
    if (maskOpnd)
    {
        *maskOpnd = nullptr;
    }
    if (indirOpndOverflowed)
    {
        *indirOpndOverflowed = false;
    }
    if (emitBailoutRef)
    {
        *emitBailoutRef = false;
    }
    IR::RegOpnd *baseOpnd = indirOpnd->GetBaseOpnd();
    AssertMsg(baseOpnd, "This shouldn't be NULL");

    // Caution: If making changes to the conditions under which we don't emit the typical array checks, make sure
    // the code in GlobOpt::ShouldAssumeIndirOpndHasNonNegativeIntIndex is updated accordingly.  We don't want the
    // global optimizer to type specialize instructions, for which the lowerer is forced to emit unconditional
    // bailouts.
    if (baseOpnd->IsTaggedInt())
    {
        return NULL;
    }

    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    if (indexOpnd)
    {
        const bool normalLocation = (flags & (Js::FldInfo_FromLocal | Js::FldInfo_FromProto | Js::FldInfo_FromLocalWithoutProperty)) != 0;
        const bool normalSlots = (flags & (Js::FldInfo_FromAuxSlots | Js::FldInfo_FromInlineSlots)) != 0;
        const bool generateFastpath = !baseOpnd->GetValueType().IsLikelyOptimizedTypedArray() && normalLocation && normalSlots && flags != Js::FldInfo_NoInfo;
        if (indexOpnd->GetValueType().IsLikelyString())
        {
            if (generateFastpath)
            {
                // If profile data says that it's a typed array - do not generate the property string fast path as the src. could be a temp and that would cause a bug.
                *pIsTypedArrayElement = false;
                *pIsStringIndex = true;
                return GenerateFastElemIStringIndexCommon(elemInstr, isStore, indirOpnd, labelHelper, flags);
            }
            else
            {
                // There's no point in generating the int index fast path if we know the index has a string value.
                return nullptr;
            }
        }
        else if (indexOpnd->GetValueType().IsLikelySymbol())
        {
            if (generateFastpath)
            {
                // If profile data says that it's a typed array - do not generate the symbol fast path as the src. could be a temp and that would cause a bug.
                return GenerateFastElemISymbolIndexCommon(elemInstr, isStore, indirOpnd, labelHelper, flags);
            }
            else
            {
                // There's no point in generating the int index fast path if we know the index has a symbol value.
                return nullptr;
            }
        }
    }
    return
        GenerateFastElemIIntIndexCommon(
            elemInstr,
            isStore,
            indirOpnd,
            labelHelper,
            labelCantUseArray,
            labelFallthrough,
            pIsTypedArrayElement,
            emitBailoutRef,
            pLabelSegmentLengthIncreased,
            checkArrayLengthOverflow,
            maskOpnd,
            false,
            returnLength,
            bailOutLabelInstr,
            indirOpndOverflowed);
}